

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O1

unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
__thiscall
duckdb::ParquetMultiFileInfo::InitializeBindData
          (ParquetMultiFileInfo *this,MultiFileBindData *multi_file_data,
          unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
          *options_p)

{
  undefined2 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  idx_t iVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  pointer pBVar9;
  pointer pPVar10;
  MultiFileList *pMVar11;
  undefined4 extraout_var;
  pointer *__ptr;
  templated_unique_single_t result;
  _Tuple_impl<0UL,_duckdb::ParquetReadBindData_*,_std::default_delete<duckdb::ParquetReadBindData>_>
  local_28;
  
  local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>)operator_new(0x78);
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).super_FunctionData._vptr_FunctionData = (_func_int **)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((ParquetReadBindData *)
  local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  explicit_cardinality = 0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).binary_as_string = false;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).file_row_number = false;
  *(undefined6 *)
   &(((ParquetReadBindData *)
     local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
    parquet_options).field_0x2 = 0;
  *(undefined8 *)
   &(((ParquetReadBindData *)
     local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
    parquet_options).debug_use_openssl = 0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).explicit_cardinality = 0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((ParquetReadBindData *)
  local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  initial_file_cardinality = 0;
  ((ParquetReadBindData *)
  local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  initial_file_row_groups = 0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ParquetReadBindData_019d4928;
  ((ParquetReadBindData *)
  local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  explicit_cardinality = 0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).binary_as_string = false;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).file_row_number = false;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).debug_use_openssl = true;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((ParquetReadBindData *)
   local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).explicit_cardinality = 0;
  pBVar9 = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
           ::operator->(options_p);
  pPVar10 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
            ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                          *)&local_28);
  uVar1 = *(undefined2 *)&pBVar9[1]._vptr_BaseFileReaderOptions;
  (pPVar10->parquet_options).binary_as_string = (bool)(char)uVar1;
  (pPVar10->parquet_options).file_row_number = (bool)(char)((ushort)uVar1 >> 8);
  uVar4 = *(undefined4 *)&pBVar9[2]._vptr_BaseFileReaderOptions;
  uVar5 = *(undefined4 *)((long)&pBVar9[2]._vptr_BaseFileReaderOptions + 4);
  uVar6 = *(undefined4 *)&pBVar9[3]._vptr_BaseFileReaderOptions;
  uVar7 = *(undefined4 *)((long)&pBVar9[3]._vptr_BaseFileReaderOptions + 4);
  pBVar9[2]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  pBVar9[3]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  this_00 = (pPVar10->parquet_options).encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  *(undefined4 *)
   &(pPVar10->parquet_options).encryption_config.internal.
    super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar4;
  *(undefined4 *)
   ((long)&(pPVar10->parquet_options).encryption_config.internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
   4) = uVar5;
  *(undefined4 *)
   &(pPVar10->parquet_options).encryption_config.internal.
    super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = uVar6;
  *(undefined4 *)
   ((long)&(pPVar10->parquet_options).encryption_config.internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar7;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (pPVar10->parquet_options).debug_use_openssl = *(bool *)&pBVar9[4]._vptr_BaseFileReaderOptions;
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  _M_move_assign(&(pPVar10->parquet_options).schema.
                  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
                 ,pBVar9 + 5);
  (pPVar10->parquet_options).explicit_cardinality = (idx_t)pBVar9[8]._vptr_BaseFileReaderOptions;
  pPVar10 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
            ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                          *)&local_28);
  if ((pPVar10->parquet_options).explicit_cardinality != 0) {
    pMVar11 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&multi_file_data->file_list);
    iVar8 = (*pMVar11->_vptr_MultiFileList[6])(pMVar11);
    pPVar10 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
              ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                            *)&local_28);
    iVar2 = (pPVar10->parquet_options).explicit_cardinality;
    pPVar10 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
              ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                            *)&local_28);
    pPVar10->explicit_cardinality = iVar2;
    pPVar10 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
              ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                            *)&local_28);
    uVar3 = pPVar10->explicit_cardinality;
    pPVar10 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
              ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                            *)&local_28);
    pPVar10->initial_file_cardinality =
         uVar3 / (CONCAT44(extraout_var,iVar8) + (ulong)(CONCAT44(extraout_var,iVar8) == 0));
  }
  *(_Head_base<0UL,_duckdb::ParquetReadBindData_*,_false> *)this =
       local_28.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         this;
}

Assistant:

unique_ptr<TableFunctionData> ParquetMultiFileInfo::InitializeBindData(MultiFileBindData &multi_file_data,
                                                                       unique_ptr<BaseFileReaderOptions> options_p) {
	auto result = make_uniq<ParquetReadBindData>();
	// Set the explicit cardinality if requested
	auto &options = options_p->Cast<ParquetFileReaderOptions>();
	result->parquet_options = std::move(options.options);
	if (result->parquet_options.explicit_cardinality) {
		auto file_count = multi_file_data.file_list->GetTotalFileCount();
		result->explicit_cardinality = result->parquet_options.explicit_cardinality;
		result->initial_file_cardinality = result->explicit_cardinality / (file_count ? file_count : 1);
	}
	return std::move(result);
}